

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O3

CharString * __thiscall icu_63::CharString::operator=(CharString *this,CharString *src)

{
  char *__src;
  int iVar1;
  char *pcVar2;
  
  if ((this->buffer).needToRelease != '\0') {
    uprv_free_63((this->buffer).ptr);
  }
  iVar1 = (src->buffer).capacity;
  (this->buffer).capacity = iVar1;
  (this->buffer).needToRelease = (src->buffer).needToRelease;
  pcVar2 = (src->buffer).ptr;
  __src = (src->buffer).stackArray;
  if (pcVar2 == __src) {
    pcVar2 = (this->buffer).stackArray;
    (this->buffer).ptr = pcVar2;
    memcpy(pcVar2,__src,(long)iVar1);
  }
  else {
    (this->buffer).ptr = pcVar2;
    (src->buffer).ptr = __src;
    (src->buffer).capacity = 0x28;
    (src->buffer).needToRelease = '\0';
  }
  this->len = src->len;
  src->len = 0;
  return this;
}

Assistant:

CharString& CharString::operator=(CharString&& src) U_NOEXCEPT {
    buffer = std::move(src.buffer);
    len = src.len;
    src.len = 0;  // not strictly necessary because we make no guarantees on the source string
    return *this;
}